

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_array.h
# Opt level: O3

iterator __thiscall
gtl::compact_array_base<int,_std::allocator<int>_>::make_hole
          (compact_array_base<int,_std::allocator<int>_> *this,const_iterator p,size_type_conflict n
          )

{
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar1;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar2;
  uint n_00;
  
  if (n != 0) {
    n_00 = (*(uint *)this & 0xffffff) + n;
    paVar2 = &this->field_7;
    paVar1 = paVar2;
    if (this->is_inlined_ == false) {
      paVar1 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
               (this->field_7).pointer_;
    }
    reallocate(this,n_00);
    if (this->is_inlined_ == false) {
      paVar2 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
               (this->field_7).pointer_;
    }
    p = (const_iterator)(((long)p - (long)paVar1 & 0x3fffffffcU) + (long)paVar2);
    memmove(p + n,p,(long)paVar2 + (((ulong)n * -4 + (ulong)n_00 * 4) - (long)p));
    set_size(this,n_00);
  }
  return p;
}

Assistant:

iterator make_hole(const_iterator p, size_type n) {
    iterator q = const_cast<iterator>(p);
    if (n != 0) {
      size_type new_size = size() + n;
      size_type index = q - Array();
      reallocate(new_size);
      q = Array() + index;
      move(q, Array() + new_size - n, q + n);
      set_size(new_size);
    }
    return q;
  }